

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInfo.cpp
# Opt level: O1

void __thiscall Rml::Debugger::ElementInfo::OnUpdate(ElementInfo *this)

{
  long lVar1;
  char cVar2;
  long *plVar3;
  double dVar4;
  
  if ((this->source_element != (Element *)0x0) &&
     ((this->update_source_element != false || (this->force_update_once == true)))) {
    cVar2 = Rml::Element::IsVisible(SUB81(this,0));
    if (cVar2 != '\0') {
      plVar3 = (long *)Rml::GetSystemInterface();
      dVar4 = (double)(**(code **)(*plVar3 + 0x10))(plVar3);
      if ((0.3 < (float)(dVar4 - this->previous_update_time)) || (this->force_update_once == true))
      {
        if ((this->force_update_once == true) && (this->source_element != (Element *)0x0)) {
          lVar1 = Rml::Element::GetOwnerDocument();
          if (lVar1 != 0) {
            Rml::ElementDocument::UpdateDocument();
          }
        }
        this->force_update_once = false;
        UpdateSourceElement(this);
      }
    }
  }
  if (this->title_dirty == true) {
    UpdateTitle(this);
    this->title_dirty = false;
  }
  return;
}

Assistant:

void ElementInfo::OnUpdate()
{
	if (source_element && (update_source_element || force_update_once) && IsVisible())
	{
		const double t = GetSystemInterface()->GetElapsedTime();
		const float dt = (float)(t - previous_update_time);

		constexpr float update_interval = 0.3f;

		if (dt > update_interval || (force_update_once))
		{
			if (force_update_once && source_element)
			{
				// Since an update is being forced, it is possibly because we are reacting to an event and made some changes.
				// Update the source element's document to reflect any recent changes.
				if (auto document = source_element->GetOwnerDocument())
					document->UpdateDocument();
			}
			force_update_once = false;

			UpdateSourceElement();
		}
	}

	if (title_dirty)
	{
		UpdateTitle();
		title_dirty = false;
	}
}